

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTableInfo::DataTableInfo
          (DataTableInfo *this,AttachedDatabase *db,
          shared_ptr<duckdb::TableIOManager,_true> *table_io_manager_p,string *schema,string *table)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  this->db = db;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (table_io_manager_p->internal).
           super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (table_io_manager_p->internal).
           super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (table_io_manager_p->internal).
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->table_io_manager).internal.
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  (table_io_manager_p->internal).
  super___shared_ptr<duckdb::TableIOManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)((long)&(this->name_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->name_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->name_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->name_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->name_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::__cxx11::string::string((string *)&this->schema,(string *)schema);
  ::std::__cxx11::string::string((string *)&this->table,(string *)table);
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->indexes).indexes_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->indexes).indexes_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->indexes).indexes_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->index_storage_infos).
  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StorageLock::StorageLock(&this->checkpoint_lock);
  return;
}

Assistant:

DataTableInfo::DataTableInfo(AttachedDatabase &db, shared_ptr<TableIOManager> table_io_manager_p, string schema,
                             string table)
    : db(db), table_io_manager(std::move(table_io_manager_p)), schema(std::move(schema)), table(std::move(table)) {
}